

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O3

double hedg::Timing::time_diff_mins(string *t1,string *t2)

{
  time_t __time1;
  time_t __time0;
  double dVar1;
  int min2;
  int hour2;
  int min;
  int hour;
  int day;
  float sec2;
  float sec;
  int day2;
  int month2;
  int year2;
  int month;
  int year;
  tm local_a0;
  tm local_68;
  
  __isoc99_sscanf((t1->_M_dataplus)._M_p,"%d-%d-%dT%d:%d:%fZ",&year,&month,&day,&hour,&min,&sec);
  __isoc99_sscanf((t2->_M_dataplus)._M_p,"%d-%d-%dT%d:%d:%fZ",&year2,&month2,&day2,&hour2,&min2,
                  &sec2);
  local_68.tm_gmtoff = 0;
  local_68.tm_zone = (char *)0x0;
  local_68.tm_wday = 0;
  local_68.tm_yday = 0;
  local_68.tm_isdst = 0;
  local_68._36_4_ = 0;
  local_68.tm_year = year + -0x76c;
  local_68.tm_mon = month + 1;
  local_68.tm_mday = day;
  local_68.tm_hour = hour;
  local_68.tm_min = min;
  local_68.tm_sec = (int)sec;
  __time1 = mktime(&local_68);
  local_a0.tm_gmtoff = 0;
  local_a0.tm_zone = (char *)0x0;
  local_a0.tm_wday = 0;
  local_a0.tm_yday = 0;
  local_a0.tm_isdst = 0;
  local_a0._36_4_ = 0;
  local_a0.tm_year = year + -0x76c;
  local_a0.tm_mon = month2 + 1;
  local_a0.tm_mday = day2;
  local_a0.tm_hour = hour2;
  local_a0.tm_min = min2;
  local_a0.tm_sec = (int)sec;
  __time0 = mktime(&local_a0);
  dVar1 = difftime(__time1,__time0);
  return dVar1 / 60.0;
}

Assistant:

double Timing::time_diff_mins(std::string t1, std::string t2) {
	int year, month, day, hour, min;
	int year2, month2, day2, hour2, min2;
	float sec, sec2;
	sscanf(t1.c_str(), "%d-%d-%dT%d:%d:%fZ", &year, &month, &day, &hour, &min, &sec);
	sscanf(t2.c_str(), "%d-%d-%dT%d:%d:%fZ", &year2, &month2, &day2, &hour2, &min2, &sec2);

	tm time1 = { 0 };
	time1.tm_year = year - 1900;
	time1.tm_mon = month + 1;
	time1.tm_mday = day;
	time1.tm_hour = hour;
	time1.tm_min = min;
	time1.tm_sec = (int)sec;
	time_t first_time = std::mktime(&time1);

	tm time2 = { 0 };
	time2.tm_year = year - 1900;
	time2.tm_mon = month2 + 1;
	time2.tm_mday = day2;
	time2.tm_hour = hour2;
	time2.tm_min = min2;
	time2.tm_sec = (int)sec;
	time_t second_time = std::mktime(&time2);

	return std::difftime(first_time, second_time) / 60;

}